

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

void __thiscall
icu_63::Normalizer2Impl::makeCanonIterDataFromNorm16
          (Normalizer2Impl *this,UChar32 start,UChar32 end,uint16_t norm16,CanonIterData *newData,
          UErrorCode *errorCode)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t *puVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  undefined6 in_register_0000000a;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int c;
  bool bVar13;
  
  uVar7 = (uint)CONCAT62(in_register_0000000a,norm16);
  if ((uVar7 != 1) && (start <= end && (this->minNoNo <= norm16 || norm16 < this->minYesNo))) {
    do {
      uVar5 = umutablecptrie_get_63(newData->mutableTrie,start);
      if (norm16 < this->minMaybeYes) {
        if (norm16 < this->minYesNo) {
          uVar12 = uVar5 | 0x40000000;
        }
        else {
          c = start;
          uVar9 = uVar7;
          if (this->limitNoNo <= norm16) {
            c = ((uint)(norm16 >> 3) + start) - (uint)this->centerNoNoDelta;
            uVar4 = getRawNorm16(this,c);
            uVar9 = (uint)uVar4;
          }
          uVar12 = uVar5;
          if (this->minYesNo < (ushort)uVar9) {
            puVar3 = this->extraData;
            uVar8 = (ulong)(uVar9 & 0xfffe);
            uVar1 = *(ushort *)((long)puVar3 + uVar8);
            if (((start == c) && ((uVar1 & 0x80) != 0)) &&
               (uVar12 = uVar5 | 0x80000000, *(char *)((long)puVar3 + (uVar8 - 2)) == '\0')) {
              uVar12 = uVar5;
            }
            if ((uVar1 & 0x1f) != 0) {
              uVar2 = *(ushort *)((long)puVar3 + uVar8 + 2);
              uVar10 = (uint)uVar2;
              uVar11 = 1;
              if ((uVar10 & 0xfc00) == 0xd800) {
                uVar10 = (uint)uVar2 * 0x400 + (uint)*(ushort *)((long)puVar3 + uVar8 + 4) +
                         0xfca02400;
                uVar11 = 2;
              }
              CanonIterData::addToStartSet(newData,start,uVar10,errorCode);
              if ((this->minNoNo <= (ushort)uVar9) && (uVar11 < (uVar1 & 0x1f))) {
                do {
                  uVar2 = *(ushort *)((long)puVar3 + (long)(int)uVar11 * 2 + uVar8 + 2);
                  uVar10 = (uint)uVar2;
                  uVar9 = uVar11 + 1;
                  if ((uVar10 & 0xfc00) == 0xd800) {
                    uVar10 = (uint)uVar2 * 0x400 +
                             (uint)*(ushort *)
                                    ((long)puVar3 + (long)(int)(uVar11 + 1) * 2 + uVar8 + 2) +
                             0xfca02400;
                    uVar9 = uVar11 + 2;
                  }
                  uVar11 = uVar9;
                  uVar6 = umutablecptrie_get_63(newData->mutableTrie,uVar10);
                  if (-1 < (int)uVar6) {
                    umutablecptrie_set_63(newData->mutableTrie,uVar10,uVar6 | 0x80000000,errorCode);
                  }
                } while ((int)uVar11 < (int)(uVar1 & 0x1f));
              }
            }
          }
          else {
            CanonIterData::addToStartSet(newData,start,c,errorCode);
          }
        }
      }
      else {
        uVar12 = uVar5 | (norm16 < 0xfc00 | 0xfffffffe) << 0x1e;
      }
      if (uVar12 != uVar5) {
        umutablecptrie_set_63(newData->mutableTrie,start,uVar12,errorCode);
      }
      bVar13 = start != end;
      start = start + 1;
    } while (bVar13);
  }
  return;
}

Assistant:

void Normalizer2Impl::makeCanonIterDataFromNorm16(UChar32 start, UChar32 end, const uint16_t norm16,
                                                  CanonIterData &newData,
                                                  UErrorCode &errorCode) const {
    if(isInert(norm16) || (minYesNo<=norm16 && norm16<minNoNo)) {
        // Inert, or 2-way mapping (including Hangul syllable).
        // We do not write a canonStartSet for any yesNo character.
        // Composites from 2-way mappings are added at runtime from the
        // starter's compositions list, and the other characters in
        // 2-way mappings get CANON_NOT_SEGMENT_STARTER set because they are
        // "maybe" characters.
        return;
    }
    for(UChar32 c=start; c<=end; ++c) {
        uint32_t oldValue = umutablecptrie_get(newData.mutableTrie, c);
        uint32_t newValue=oldValue;
        if(isMaybeOrNonZeroCC(norm16)) {
            // not a segment starter if it occurs in a decomposition or has cc!=0
            newValue|=CANON_NOT_SEGMENT_STARTER;
            if(norm16<MIN_NORMAL_MAYBE_YES) {
                newValue|=CANON_HAS_COMPOSITIONS;
            }
        } else if(norm16<minYesNo) {
            newValue|=CANON_HAS_COMPOSITIONS;
        } else {
            // c has a one-way decomposition
            UChar32 c2=c;
            // Do not modify the whole-range norm16 value.
            uint16_t norm16_2=norm16;
            if (isDecompNoAlgorithmic(norm16_2)) {
                // Maps to an isCompYesAndZeroCC.
                c2 = mapAlgorithmic(c2, norm16_2);
                norm16_2 = getRawNorm16(c2);
                // No compatibility mappings for the CanonicalIterator.
                U_ASSERT(!(isHangulLV(norm16_2) || isHangulLVT(norm16_2)));
            }
            if (norm16_2 > minYesNo) {
                // c decomposes, get everything from the variable-length extra data
                const uint16_t *mapping=getMapping(norm16_2);
                uint16_t firstUnit=*mapping;
                int32_t length=firstUnit&MAPPING_LENGTH_MASK;
                if((firstUnit&MAPPING_HAS_CCC_LCCC_WORD)!=0) {
                    if(c==c2 && (*(mapping-1)&0xff)!=0) {
                        newValue|=CANON_NOT_SEGMENT_STARTER;  // original c has cc!=0
                    }
                }
                // Skip empty mappings (no characters in the decomposition).
                if(length!=0) {
                    ++mapping;  // skip over the firstUnit
                    // add c to first code point's start set
                    int32_t i=0;
                    U16_NEXT_UNSAFE(mapping, i, c2);
                    newData.addToStartSet(c, c2, errorCode);
                    // Set CANON_NOT_SEGMENT_STARTER for each remaining code point of a
                    // one-way mapping. A 2-way mapping is possible here after
                    // intermediate algorithmic mapping.
                    if(norm16_2>=minNoNo) {
                        while(i<length) {
                            U16_NEXT_UNSAFE(mapping, i, c2);
                            uint32_t c2Value = umutablecptrie_get(newData.mutableTrie, c2);
                            if((c2Value&CANON_NOT_SEGMENT_STARTER)==0) {
                                umutablecptrie_set(newData.mutableTrie, c2,
                                                   c2Value|CANON_NOT_SEGMENT_STARTER, &errorCode);
                            }
                        }
                    }
                }
            } else {
                // c decomposed to c2 algorithmically; c has cc==0
                newData.addToStartSet(c, c2, errorCode);
            }
        }
        if(newValue!=oldValue) {
            umutablecptrie_set(newData.mutableTrie, c, newValue, &errorCode);
        }
    }
}